

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObjectPrivate::moveToThread_helper(QObjectPrivate *this)

{
  QObject *receiver;
  ulong uVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  receiver = (this->super_QObjectData).q_ptr;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)local_38,ThreadChange);
  QCoreApplication::sendEvent(receiver,(QEvent *)local_38);
  QBindingStorage::clear(&(this->super_QObjectData).bindingStorage);
  if ((this->super_QObjectData).children.d.size != 0) {
    uVar1 = 0;
    do {
      moveToThread_helper((QObjectPrivate *)
                          ((this->super_QObjectData).children.d.ptr[uVar1]->d_ptr).d);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)(this->super_QObjectData).children.d.size);
  }
  QTimerEvent::~QTimerEvent((QTimerEvent *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObjectPrivate::moveToThread_helper()
{
    Q_Q(QObject);
    QEvent e(QEvent::ThreadChange);
    QCoreApplication::sendEvent(q, &e);
    bindingStorage.clear();
    for (int i = 0; i < children.size(); ++i) {
        QObject *child = children.at(i);
        child->d_func()->moveToThread_helper();
    }
}